

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_2.cpp
# Opt level: O2

int main(void)

{
  char op;
  int a;
  int b;
  int iVar1;
  ostream *poVar2;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"First number",&local_41);
  a = get_number(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Second number",&local_41);
  b = get_number(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Operator [+ - * /]",&local_41);
  op = get_sym(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  iVar1 = evaluate(a,b,op);
  poVar2 = std::operator<<((ostream *)&std::cout,"Result of ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,a);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,op);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,b);
  poVar2 = std::operator<<(poVar2," = ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  std::operator<<(poVar2,'\n');
  return 0;
}

Assistant:

int main()
{
	int const a = get_number("First number");
	int const b = get_number("Second number");
	char const op = get_sym("Operator [+ - * /]");
	int const c = evaluate(a, b, op);

	cout << "Result of " << a << " " << op << " " << b << " = " << c << '\n';

	return EXIT_SUCCESS;
}